

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastQueue.cpp
# Opt level: O0

Bucket * __thiscall FastQueue::dequeue(FastQueue *this)

{
  uint32_t uVar1;
  bool bVar2;
  reference ppBVar3;
  pthread_mutex_t *__mutex;
  int bucket_index;
  FastQueue *this_local;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->global_mutex);
  while( true ) {
    bVar2 = empty(this);
    if (!bVar2) break;
    pthread_cond_wait((pthread_cond_t *)&this->empty_cond,(pthread_mutex_t *)&this->global_mutex);
  }
  uVar1 = this->head;
  ppBVar3 = std::vector<Bucket_*,_std::allocator<Bucket_*>_>::operator[]
                      (&this->buckets,(ulong)this->head);
  __mutex = Bucket::get_mutex(*ppBVar3);
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  this->head = (this->head + 1) % this->num_buckets;
  pthread_mutex_unlock((pthread_mutex_t *)&this->global_mutex);
  pthread_cond_signal((pthread_cond_t *)&this->full_cond);
  ppBVar3 = std::vector<Bucket_*,_std::allocator<Bucket_*>_>::operator[]
                      (&this->buckets,(long)(int)uVar1);
  return *ppBVar3;
}

Assistant:

Bucket* FastQueue::dequeue(){
    int bucket_index;
    pthread_mutex_lock(&global_mutex);                          //lock global mutex to avoid  
    
    while(empty()){
        pthread_cond_wait(&empty_cond, &global_mutex);          //the thread block if the queue is empty
    }
    
    
    bucket_index = head;
    
    pthread_mutex_lock(&(buckets[head]->get_mutex()));            //lock the bukcet to avoid the comprtition between enqueue and dequeue threads
  
    head = (head + 1) % num_buckets;
    
    pthread_mutex_unlock(&global_mutex);                        //Here, may lead long time block, if the bucket is not consumed.
    
    pthread_cond_signal(&full_cond);

 
    return buckets[bucket_index];
}